

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<Fad<double>_>::AddSub
          (TPZMatrix<Fad<double>_> *this,int64_t sRow,int64_t sCol,TPZFMatrix<Fad<double>_> *A)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> local_a0;
  Fad<double> local_90;
  Fad<double> local_70;
  Fad<double> local_50;
  
  lVar3 = (this->super_TPZBaseMatrix).fRow - sRow;
  lVar4 = (A->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  lVar1 = (A->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
  if (lVar4 < lVar3) {
    lVar3 = lVar4;
  }
  lVar4 = (this->super_TPZBaseMatrix).fCol - sCol;
  if (lVar1 < lVar4) {
    lVar4 = lVar1;
  }
  lVar1 = 0;
  if (lVar4 < 1) {
    lVar4 = lVar1;
  }
  if (lVar3 < 1) {
    lVar3 = lVar1;
  }
  for (; lVar1 != lVar3; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar4 != lVar2; lVar2 = lVar2 + 1) {
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&local_70,this,sRow,sCol + lVar2);
      (*(A->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
        [0x24])(&local_90,A,lVar1,lVar2);
      local_a0.fadexpr_.left_ = &local_70;
      local_a0.fadexpr_.right_ = &local_90;
      Fad<double>::Fad<FadBinaryAdd<Fad<double>,Fad<double>>>(&local_50,&local_a0);
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                (this,sRow,sCol + lVar2,&local_50);
      Fad<double>::~Fad(&local_50);
      Fad<double>::~Fad(&local_90);
      Fad<double>::~Fad(&local_70);
    }
    sRow = sRow + 1;
  }
  return 1;
}

Assistant:

int TPZMatrix<TVar>::AddSub(const int64_t sRow,const int64_t sCol,const TPZFMatrix<TVar> &A ) {
	
    int64_t minRow = MIN( A.Rows(), Rows() - sRow );
    int64_t minCol = MIN( A.Cols(), Cols() - sCol );
	//  REAL v;
	
	int64_t row = sRow;
    for ( int64_t r = 0; r < minRow; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = 0; c < minCol; c++, col++ ) {
            PutVal( row, col, GetVal( row, col ) + A.GetVal( r, c ) );
        }
    }
    return( 1 );
}